

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::BeginColumns(char *str_id,int columns_count,ImGuiOldColumnFlags flags)

{
  float fVar1;
  int iVar2;
  ImGuiWindow *window;
  ImGuiOldColumnData *pIVar3;
  ImVec2 IVar4;
  ImGuiContext *pIVar5;
  ImGuiID id;
  ImGuiOldColumns *pIVar6;
  ImGuiOldColumnData *pIVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  int n;
  ulong uVar11;
  int iVar12;
  ImGuiContext *g;
  ulong uVar13;
  bool bVar14;
  uint uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  
  pIVar5 = GImGui;
  window = GImGui->CurrentWindow;
  window->WriteAccessed = true;
  if (columns_count < 1) {
    __assert_fail("columns_count >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                  ,0xe54,"void ImGui::BeginColumns(const char *, int, ImGuiOldColumnFlags)");
  }
  if ((window->DC).CurrentColumns == (ImGuiOldColumns *)0x0) {
    id = GetColumnsID(str_id,columns_count);
    pIVar6 = FindOrCreateColumns(window,id);
    if (pIVar6->ID != id) {
      __assert_fail("columns->ID == id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                    ,0xe5a,"void ImGui::BeginColumns(const char *, int, ImGuiOldColumnFlags)");
    }
    pIVar6->Current = 0;
    pIVar6->Count = columns_count;
    pIVar6->Flags = flags;
    (window->DC).CurrentColumns = pIVar6;
    pIVar6->HostCursorPosY = (window->DC).CursorPos.y;
    pIVar6->HostCursorMaxPosX = (window->DC).CursorMaxPos.x;
    IVar4 = (window->ClipRect).Max;
    (pIVar6->HostInitialClipRect).Min = (window->ClipRect).Min;
    (pIVar6->HostInitialClipRect).Max = IVar4;
    IVar4 = (window->ParentWorkRect).Max;
    (pIVar6->HostBackupParentWorkRect).Min = (window->ParentWorkRect).Min;
    (pIVar6->HostBackupParentWorkRect).Max = IVar4;
    IVar4 = (window->WorkRect).Max;
    (window->ParentWorkRect).Min = (window->WorkRect).Min;
    (window->ParentWorkRect).Max = IVar4;
    fVar1 = (pIVar5->Style).ItemSpacing.x;
    fVar16 = (window->WindowPadding).x;
    fVar18 = fVar1 - fVar16;
    fVar16 = fVar16 * 0.5;
    uVar15 = -(uint)(window->WindowBorderSize <= fVar16);
    fVar17 = (window->WorkRect).Max.x;
    fVar18 = (float)(-(uint)(0.0 <= fVar18) & (uint)fVar18);
    fVar19 = (fVar1 + fVar17) - fVar18;
    fVar17 = (float)(int)(float)(~uVar15 & (uint)window->WindowBorderSize | (uint)fVar16 & uVar15) +
             fVar17;
    if (fVar17 <= fVar19) {
      fVar19 = fVar17;
    }
    fVar18 = ((window->DC).Indent.x - fVar1) + fVar18;
    pIVar6->OffMinX = fVar18;
    fVar19 = fVar19 - (window->Pos).x;
    fVar18 = fVar18 + 1.0;
    uVar15 = -(uint)(fVar18 <= fVar19);
    pIVar6->OffMaxX = (float)(~uVar15 & (uint)fVar18 | (uint)fVar19 & uVar15);
    fVar16 = (window->DC).CursorPos.y;
    pIVar6->LineMaxY = fVar16;
    pIVar6->LineMinY = fVar16;
    uVar15 = (pIVar6->Columns).Size;
    uVar9 = columns_count + 1;
    if (uVar15 != uVar9 && uVar15 != 0) {
      iVar12 = (pIVar6->Columns).Capacity;
      if (iVar12 < 0) {
        uVar15 = iVar12 / 2 + iVar12;
        uVar11 = 0;
        if (0 < (int)uVar15) {
          uVar11 = (ulong)uVar15;
        }
        pIVar7 = (ImGuiOldColumnData *)MemAlloc(uVar11 * 0x1c);
        pIVar3 = (pIVar6->Columns).Data;
        if (pIVar3 != (ImGuiOldColumnData *)0x0) {
          memcpy(pIVar7,pIVar3,(long)(pIVar6->Columns).Size * 0x1c);
          MemFree((pIVar6->Columns).Data);
        }
        (pIVar6->Columns).Data = pIVar7;
        (pIVar6->Columns).Capacity = (int)uVar11;
      }
      (pIVar6->Columns).Size = 0;
    }
    bVar14 = (pIVar6->Columns).Size == 0;
    pIVar6->IsFirstFrame = bVar14;
    if (bVar14) {
      if ((pIVar6->Columns).Capacity <= columns_count) {
        pIVar7 = (ImGuiOldColumnData *)MemAlloc((ulong)uVar9 * 0x1c);
        pIVar3 = (pIVar6->Columns).Data;
        if (pIVar3 != (ImGuiOldColumnData *)0x0) {
          memcpy(pIVar7,pIVar3,(long)(pIVar6->Columns).Size * 0x1c);
          MemFree((pIVar6->Columns).Data);
        }
        (pIVar6->Columns).Data = pIVar7;
        (pIVar6->Columns).Capacity = uVar9;
      }
      uVar15 = 0;
      do {
        iVar12 = (pIVar6->Columns).Size;
        iVar2 = (pIVar6->Columns).Capacity;
        if (iVar12 == iVar2) {
          if (iVar2 == 0) {
            iVar8 = 8;
          }
          else {
            iVar8 = iVar2 / 2 + iVar2;
          }
          iVar12 = iVar12 + 1;
          if (iVar12 < iVar8) {
            iVar12 = iVar8;
          }
          if (iVar2 < iVar12) {
            pIVar7 = (ImGuiOldColumnData *)MemAlloc((long)iVar12 * 0x1c);
            pIVar3 = (pIVar6->Columns).Data;
            if (pIVar3 != (ImGuiOldColumnData *)0x0) {
              memcpy(pIVar7,pIVar3,(long)(pIVar6->Columns).Size * 0x1c);
              MemFree((pIVar6->Columns).Data);
            }
            (pIVar6->Columns).Data = pIVar7;
            (pIVar6->Columns).Capacity = iVar12;
          }
        }
        pIVar3 = (pIVar6->Columns).Data;
        iVar12 = (pIVar6->Columns).Size;
        pIVar3[iVar12].OffsetNorm = (float)(int)uVar15 / (float)columns_count;
        pIVar7 = pIVar3 + iVar12;
        pIVar7->OffsetNormBeforeResize = 0.0;
        pIVar7->Flags = 0;
        (((ImRect *)(&pIVar7->OffsetNormBeforeResize + 2))->Min).x = 0.0;
        (((ImRect *)(&pIVar7->OffsetNormBeforeResize + 2))->Min).y = 0.0;
        pIVar3[iVar12].ClipRect.Max.x = 0.0;
        pIVar3[iVar12].ClipRect.Max.y = 0.0;
        (pIVar6->Columns).Size = (pIVar6->Columns).Size + 1;
        uVar15 = uVar15 + 1;
      } while (uVar9 != uVar15);
    }
    uVar11 = 1;
    if (1 < columns_count) {
      uVar11 = (ulong)(uint)columns_count;
    }
    lVar10 = 0xc;
    uVar13 = 0;
    do {
      if ((long)(pIVar6->Columns).Size <= (long)uVar13) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.h"
                      ,0x658,
                      "T &ImVector<ImGuiOldColumnData>::operator[](int) [T = ImGuiOldColumnData]");
      }
      pIVar3 = (pIVar6->Columns).Data;
      fVar16 = (window->Pos).x;
      fVar19 = GetColumnOffset((int)uVar13);
      fVar17 = (window->Pos).x;
      uVar13 = uVar13 + 1;
      fVar18 = GetColumnOffset((int)uVar13);
      *(float *)((long)&pIVar3->OffsetNorm + lVar10) = (float)(int)(fVar19 + fVar16 + 0.5);
      *(undefined4 *)((long)&pIVar3->OffsetNormBeforeResize + lVar10) = 0xff7fffff;
      *(float *)((long)&pIVar3->Flags + lVar10) = (float)(int)(fVar18 + fVar17 + -1.0 + 0.5);
      *(undefined4 *)((long)&(pIVar3->ClipRect).Min.x + lVar10) = 0x7f7fffff;
      ImRect::ClipWithFull((ImRect *)((long)&pIVar3->OffsetNorm + lVar10),&window->ClipRect);
      lVar10 = lVar10 + 0x1c;
    } while (uVar11 != uVar13);
    if (1 < pIVar6->Count) {
      ImDrawListSplitter::Split(&pIVar6->Splitter,window->DrawList,pIVar6->Count + 1);
      ImDrawListSplitter::SetCurrentChannel(&pIVar6->Splitter,window->DrawList,1);
      PushColumnClipRect(0);
    }
    fVar16 = GetColumnOffset(pIVar6->Current);
    fVar17 = GetColumnOffset(pIVar6->Current + 1);
    PushItemWidth((fVar17 - fVar16) * 0.65);
    fVar19 = fVar1 - (window->WindowPadding).x;
    fVar19 = (float)(-(uint)(0.0 <= fVar19) & (uint)fVar19);
    (window->DC).ColumnsOffset.x = fVar19;
    fVar16 = (window->Pos).x;
    (window->DC).CursorPos.x = (float)(int)((window->DC).Indent.x + fVar16 + fVar19);
    (window->WorkRect).Max.x = (fVar17 + fVar16) - fVar1;
    return;
  }
  __assert_fail("window->DC.CurrentColumns == __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                ,0xe55,"void ImGui::BeginColumns(const char *, int, ImGuiOldColumnFlags)");
}

Assistant:

void ImGui::BeginColumns(const char* str_id, int columns_count, ImGuiOldColumnFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    IM_ASSERT(columns_count >= 1);
    IM_ASSERT(window->DC.CurrentColumns == NULL);   // Nested columns are currently not supported

    // Acquire storage for the columns set
    ImGuiID id = GetColumnsID(str_id, columns_count);
    ImGuiOldColumns* columns = FindOrCreateColumns(window, id);
    IM_ASSERT(columns->ID == id);
    columns->Current = 0;
    columns->Count = columns_count;
    columns->Flags = flags;
    window->DC.CurrentColumns = columns;

    columns->HostCursorPosY = window->DC.CursorPos.y;
    columns->HostCursorMaxPosX = window->DC.CursorMaxPos.x;
    columns->HostInitialClipRect = window->ClipRect;
    columns->HostBackupParentWorkRect = window->ParentWorkRect;
    window->ParentWorkRect = window->WorkRect;

    // Set state for first column
    // We aim so that the right-most column will have the same clipping width as other after being clipped by parent ClipRect
    const float column_padding = g.Style.ItemSpacing.x;
    const float half_clip_extend_x = ImFloor(ImMax(window->WindowPadding.x * 0.5f, window->WindowBorderSize));
    const float max_1 = window->WorkRect.Max.x + column_padding - ImMax(column_padding - window->WindowPadding.x, 0.0f);
    const float max_2 = window->WorkRect.Max.x + half_clip_extend_x;
    columns->OffMinX = window->DC.Indent.x - column_padding + ImMax(column_padding - window->WindowPadding.x, 0.0f);
    columns->OffMaxX = ImMax(ImMin(max_1, max_2) - window->Pos.x, columns->OffMinX + 1.0f);
    columns->LineMinY = columns->LineMaxY = window->DC.CursorPos.y;

    // Clear data if columns count changed
    if (columns->Columns.Size != 0 && columns->Columns.Size != columns_count + 1)
        columns->Columns.resize(0);

    // Initialize default widths
    columns->IsFirstFrame = (columns->Columns.Size == 0);
    if (columns->Columns.Size == 0)
    {
        columns->Columns.reserve(columns_count + 1);
        for (int n = 0; n < columns_count + 1; n++)
        {
            ImGuiOldColumnData column;
            column.OffsetNorm = n / (float)columns_count;
            columns->Columns.push_back(column);
        }
    }

    for (int n = 0; n < columns_count; n++)
    {
        // Compute clipping rectangle
        ImGuiOldColumnData* column = &columns->Columns[n];
        float clip_x1 = IM_ROUND(window->Pos.x + GetColumnOffset(n));
        float clip_x2 = IM_ROUND(window->Pos.x + GetColumnOffset(n + 1) - 1.0f);
        column->ClipRect = ImRect(clip_x1, -FLT_MAX, clip_x2, +FLT_MAX);
        column->ClipRect.ClipWithFull(window->ClipRect);
    }

    if (columns->Count > 1)
    {
        columns->Splitter.Split(window->DrawList, 1 + columns->Count);
        columns->Splitter.SetCurrentChannel(window->DrawList, 1);
        PushColumnClipRect(0);
    }

    // We don't generally store Indent.x inside ColumnsOffset because it may be manipulated by the user.
    float offset_0 = GetColumnOffset(columns->Current);
    float offset_1 = GetColumnOffset(columns->Current + 1);
    float width = offset_1 - offset_0;
    PushItemWidth(width * 0.65f);
    window->DC.ColumnsOffset.x = ImMax(column_padding - window->WindowPadding.x, 0.0f);
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
    window->WorkRect.Max.x = window->Pos.x + offset_1 - column_padding;
}